

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void SubtractionHelper<short,_long,_8>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (short *lhs,long *rhs,short *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = (long)*lhs;
  lVar1 = *rhs;
  lVar2 = lVar3 - lVar1;
  if (lVar3 < 0) {
    if (lVar1 < 0) {
      if (lVar2 < 0x8000) goto LAB_00116622;
      goto LAB_0011662e;
    }
    if (lVar3 < lVar2) goto LAB_0011662e;
  }
  else if (lVar1 < 0) {
    if ((lVar2 < lVar3) || (0x7fff < lVar2)) goto LAB_0011662e;
    goto LAB_00116622;
  }
  if (lVar2 < -0x8000) {
LAB_0011662e:
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
LAB_00116622:
  *result = (short)lVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is a 32-bit int or less, rhs std::int64_t
        // we have essentially 4 cases:
        //
        // lhs positive, rhs positive - rhs could be larger than lhs can represent
        // lhs positive, rhs negative - additive case - check tmp >= lhs and tmp > max int
        // lhs negative, rhs positive - check tmp <= lhs and tmp < min int
        // lhs negative, rhs negative - addition cannot internally overflow, check against max

        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs - (std::uint64_t)rhs);

        if( lhs >= 0 )
        {
            // first case
            if( rhs >= 0 )
            {
                if( tmp >= std::numeric_limits<T>::min() )
                {
                    result = (T)tmp;
                    return;
                }
            }
            else
            {
                // second case
                if( tmp >= lhs && tmp <= std::numeric_limits<T>::max() )
                {
                    result = (T)tmp;
                    return;
                }
            }
        }
        else
        {
            // lhs < 0
            // third case
            if( rhs >= 0 )
            {
                if( tmp <= lhs && tmp >= std::numeric_limits<T>::min() )
                {
                    result = (T)tmp;
                    return;
                }
            }
            else
            {
                // fourth case
                if( tmp <= std::numeric_limits<T>::max() )
                {
                    result = (T)tmp;
                    return;
                }
            }
        }

        E::SafeIntOnOverflow();
    }